

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O2

int jpc_poc_dumpparms(jpc_ms_t *ms,FILE *out)

{
  jpc_pocpchg_t *pjVar1;
  uint uVar2;
  
  pjVar1 = (ms->parms).poc.pchgs;
  for (uVar2 = 0; (int)uVar2 < (ms->parms).soc; uVar2 = uVar2 + 1) {
    fprintf((FILE *)out,"po[%d] = %d; ",(ulong)uVar2,(ulong)pjVar1->prgord);
    fprintf((FILE *)out,"cs[%d] = %lu; ce[%d] = %lu; ",(ulong)uVar2,pjVar1->compnostart,(ulong)uVar2
            ,pjVar1->compnoend);
    fprintf((FILE *)out,"rs[%d] = %d; re[%d] = %d; ",(ulong)uVar2,(ulong)pjVar1->rlvlnostart,
            (ulong)uVar2,(ulong)pjVar1->rlvlnoend);
    fprintf((FILE *)out,"le[%d] = %lu\n",(ulong)uVar2,pjVar1->lyrnoend);
    pjVar1 = pjVar1 + 1;
  }
  return 0;
}

Assistant:

static int jpc_poc_dumpparms(jpc_ms_t *ms, FILE *out)
{
	jpc_poc_t *poc = &ms->parms.poc;
	jpc_pocpchg_t *pchg;
	int pchgno;
	for (pchgno = 0, pchg = poc->pchgs; pchgno < poc->numpchgs;
	  ++pchgno, ++pchg) {
		fprintf(out, "po[%d] = %d; ", pchgno, pchg->prgord);
		fprintf(out, "cs[%d] = %"PRIuFAST16"; ce[%d] = %"PRIuFAST16"; ",
		  pchgno, pchg->compnostart, pchgno, pchg->compnoend);
		fprintf(out, "rs[%d] = %d; re[%d] = %d; ",
		  pchgno, pchg->rlvlnostart, pchgno, pchg->rlvlnoend);
		fprintf(out, "le[%d] = %"PRIuFAST16"\n", pchgno, pchg->lyrnoend);
	}
	return 0;
}